

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.cpp
# Opt level: O3

int main(void)

{
  tuple<Kompositum::Component_*,_std::default_delete<Kompositum::Component>_> tVar1;
  pointer *__ptr;
  Printer printer;
  Composite composite;
  __uniq_ptr_impl<Kompositum::Component,_std::default_delete<Kompositum::Component>_> local_98;
  __uniq_ptr_impl<Kompositum::Component,_std::default_delete<Kompositum::Component>_> local_90;
  _Head_base<0UL,_Kompositum::Component_*,_false> local_88;
  __uniq_ptr_impl<Kompositum::Component,_std::default_delete<Kompositum::Component>_> local_80;
  __uniq_ptr_impl<Kompositum::Component,_std::default_delete<Kompositum::Component>_> local_78;
  __uniq_ptr_impl<Kompositum::Component,_std::default_delete<Kompositum::Component>_> local_70;
  long *local_68;
  Printer local_60;
  undefined1 local_50 [16];
  pointer local_40;
  pointer puStack_38;
  pointer local_30;
  
  local_50._8_8_ = 1;
  local_50._0_8_ = &PTR__Composite_00103cf0;
  local_40 = (pointer)0x0;
  puStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  local_70._M_t.
  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
  super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl =
       (tuple<Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
       operator_new(0x10);
  *(long *)((long)local_70._M_t.
                  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                  .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 8) = 2;
  *(undefined ***)
   local_70._M_t.
   super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
   super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl = &PTR__Component_00103d98;
  std::
  vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
  ::emplace_back<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>
            ((vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
              *)&local_40,
             (unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_> *)
             &local_70);
  if ((_Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
      local_70._M_t.
      super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
      super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl != (Component *)0x0) {
    (**(code **)(*(long *)local_70._M_t.
                          super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                          .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 8))
              ();
  }
  local_70._M_t.
  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
  super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl =
       (tuple<Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
       (_Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)0x0;
  local_78._M_t.
  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
  super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl =
       (tuple<Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
       operator_new(0x28);
  *(long *)((long)local_78._M_t.
                  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                  .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 8) = 3;
  *(undefined ***)
   local_78._M_t.
   super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
   super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl = &PTR__Composite_00103cf0;
  *(long *)((long)local_78._M_t.
                  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                  .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 0x10) = 0;
  *(long *)((long)local_78._M_t.
                  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                  .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 0x18) = 0;
  *(long *)((long)local_78._M_t.
                  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                  .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 0x20) = 0;
  std::
  vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
  ::emplace_back<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>
            ((vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
              *)&local_40,
             (unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_> *)
             &local_78);
  if ((_Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
      local_78._M_t.
      super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
      super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl != (Component *)0x0) {
    (**(code **)(*(long *)local_78._M_t.
                          super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                          .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 8))
              ();
  }
  local_78._M_t.
  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
  super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl =
       (tuple<Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
       (_Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)0x0;
  tVar1.super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
  .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
       operator_new(0x28);
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                  .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 8) = 4;
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
   super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl = &PTR__Composite_00103cf0;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                  .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 0x10) = 0;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                  .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 0x18) = 0;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                  .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 0x20) = 0;
  local_80._M_t.
  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
  super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl =
       (tuple<Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
       operator_new(0x10);
  *(long *)((long)local_80._M_t.
                  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                  .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 8) = 5;
  *(undefined ***)
   local_80._M_t.
   super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
   super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl = &PTR__Component_00103d98;
  std::
  vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
  ::emplace_back<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>
            ((vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
              *)((long)tVar1.
                       super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                       .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 0x10),
             (unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_> *)
             &local_80);
  if ((_Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
      local_80._M_t.
      super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
      super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl != (Component *)0x0) {
    (**(code **)(*(long *)local_80._M_t.
                          super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                          .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 8))
              ();
  }
  local_80._M_t.
  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
  super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl =
       (tuple<Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
       (_Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)0x0;
  local_88._M_head_impl = (Component *)operator_new(0x10);
  (local_88._M_head_impl)->uid = 6;
  (local_88._M_head_impl)->_vptr_Component = (_func_int **)&PTR__Component_00103d98;
  std::
  vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
  ::emplace_back<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>
            ((vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
              *)((long)tVar1.
                       super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                       .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 0x10),
             (unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_> *)
             &local_88);
  if (local_88._M_head_impl != (Component *)0x0) {
    (*(local_88._M_head_impl)->_vptr_Component[1])();
  }
  local_88._M_head_impl = (Component *)0x0;
  local_90._M_t.
  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
  super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl =
       (tuple<Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
       (tuple<Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
       tVar1.
       super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
       super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
  ::emplace_back<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>
            ((vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
              *)&local_40,
             (unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_> *)
             &local_90);
  if ((_Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
      local_90._M_t.
      super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
      super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl != (Component *)0x0) {
    (**(code **)(*(long *)local_90._M_t.
                          super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                          .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 8))
              ();
  }
  local_90._M_t.
  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
  super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl =
       (tuple<Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
       (_Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)0x0;
  local_98._M_t.
  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
  super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl =
       (tuple<Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
       operator_new(0x10);
  *(long *)((long)local_98._M_t.
                  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                  .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 8) = 7;
  *(undefined ***)
   local_98._M_t.
   super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
   super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl = &PTR__Component_00103d98;
  std::
  vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
  ::emplace_back<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>
            ((vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
              *)&local_40,
             (unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_> *)
             &local_98);
  if ((_Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
      local_98._M_t.
      super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
      super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl != (Component *)0x0) {
    (**(code **)(*(long *)local_98._M_t.
                          super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                          .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl + 8))
              ();
  }
  local_98._M_t.
  super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
  super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl =
       (tuple<Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
       (_Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)0x0;
  local_60.super_Visitor._vptr_Visitor = (_func_int **)&PTR__Visitor_00103d40;
  local_60.indent = 0;
  Kompositum::Printer::visit(&local_60,(Composite *)local_50);
  Kompositum::buildComposite((Kompositum *)&local_68,1,&kTreeDef);
  local_60.super_Visitor._vptr_Visitor = (_func_int **)&PTR__Visitor_00103d40;
  local_60.indent = 0;
  (**(code **)(*local_68 + 0x10))(local_68);
  (**(code **)(*local_68 + 8))(local_68);
  local_50._0_8_ = &PTR__Composite_00103cf0;
  std::
  vector<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>,_std::allocator<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>_>_>
  ::~vector((vector<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>,_std::allocator<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>_>_>
             *)&local_40);
  return 0;
}

Assistant:

int main(void) {
    Composite composite(1);

    composite.addChild(make_unique<Leaf>(2ull));
    composite.addChild(make_unique<Composite>(3ull));

    auto composite4 = make_unique<Composite>(4ull);
    composite4->addChild(make_unique<Leaf>(5ull));
    composite4->addChild(make_unique<Leaf>(6ull));

    composite.addChild(std::move(composite4));

    composite.addChild(make_unique<Leaf>(7ull));

    {
        Printer printer;
        composite.accept(printer);
    }

    auto componentTree = buildComposite(1, kTreeDef);

    {
        Printer printer;
        componentTree->accept(printer);
    }
}